

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::findCompositeConstant(Builder *this,Op typeClass,Vector<Id> *comps)

{
  long lVar1;
  pointer puVar2;
  pointer ppIVar3;
  pointer puVar4;
  bool bVar5;
  Id IVar6;
  Instruction *pIVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (typeClass == OpTypeCooperativeMatrixKHR) {
    ppIVar3 = (this->coopmatConstants).
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = 0;
    pIVar7 = (Instruction *)0x0;
    bVar5 = false;
    while ((lVar11 < (int)((ulong)((long)(this->coopmatConstants).
                                         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3)
                          >> 3) && (!bVar5))) {
      pIVar7 = ppIVar3[lVar11];
      if (*(pIVar7->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start ==
          *(comps->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start) {
        bVar5 = true;
      }
      lVar11 = lVar11 + 1;
    }
    IVar6 = 0;
    if (bVar5) {
LAB_00197fe0:
      IVar6 = pIVar7->resultId;
    }
  }
  else {
    ppIVar3 = this->groupedConstants[typeClass].
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (ulong)((long)this->groupedConstants[typeClass].
                           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3) >> 3;
    puVar4 = (comps->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar9 = (ulong)((long)(comps->
                          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4) >> 2;
    IVar6 = 0;
    uVar13 = uVar12 & 0xffffffff;
    if ((int)uVar12 < 1) {
      uVar13 = 0;
    }
    iVar8 = (int)uVar9;
    uVar12 = 0;
    if (0 < iVar8) {
      uVar12 = uVar9 & 0xffffffff;
    }
    for (uVar9 = 0; uVar9 != uVar13; uVar9 = uVar9 + 1) {
      pIVar7 = ppIVar3[uVar9];
      lVar11 = *(long *)&(pIVar7->operands).
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data;
      if ((int)((ulong)((long)*(pointer *)
                               ((long)&(pIVar7->operands).
                                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                       ._M_impl + 8) - lVar11) >> 2) == iVar8) {
        uVar10 = 0;
        do {
          if (uVar12 == uVar10) goto LAB_00197fe0;
          lVar1 = uVar10 * 4;
          puVar2 = puVar4 + uVar10;
          uVar10 = uVar10 + 1;
        } while (*(uint *)(lVar11 + lVar1) == *puVar2);
      }
    }
  }
  return IVar6;
}

Assistant:

Id Builder::findCompositeConstant(Op typeClass, const dxil_spv::Vector<Id>& comps) const
{
    Instruction* constant = 0;
    bool found = false;

    if (typeClass == spv::OpTypeCooperativeMatrixKHR) {
        for (int i = 0; i < (int)coopmatConstants.size() && !found; ++i) {
            constant = coopmatConstants[i];
            if (constant->getIdOperand(0) == comps[0])
                found = true;
        }
    } else {
        for (int i = 0; i < (int) groupedConstants[typeClass].size(); ++i) {
            constant = groupedConstants[typeClass][i];

            // same shape?
            if (constant->getNumOperands() != (int) comps.size())
                continue;

            // same contents?
            bool mismatch = false;
            for (int op = 0; op < constant->getNumOperands(); ++op)
            {
                if (constant->getIdOperand(op) != comps[op])
                {
                    mismatch = true;
                    break;
                }
            }
            if (!mismatch)
            {
                found = true;
                break;
            }
        }
    }

    return found ? constant->getResultId() : NoResult;
}